

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O2

void __thiscall
asio::detail::strand_service::on_dispatch_exit::~on_dispatch_exit(on_dispatch_exit *this)

{
  strand_impl *psVar1;
  scheduler_operation *psVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->impl_->mutex_);
  op_queue<asio::detail::scheduler_operation>::push<asio::detail::scheduler_operation>
            (&this->impl_->ready_queue_,&this->impl_->waiting_queue_);
  psVar1 = this->impl_;
  psVar2 = (psVar1->ready_queue_).front_;
  psVar1->locked_ = psVar2 != (scheduler_operation *)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&psVar1->mutex_);
  if (psVar2 != (scheduler_operation *)0x0) {
    scheduler::post_immediate_completion(this->io_context_impl_,&this->impl_->super_operation,false)
    ;
  }
  return;
}

Assistant:

~on_dispatch_exit()
  {
    impl_->mutex_.lock();
    impl_->ready_queue_.push(impl_->waiting_queue_);
    bool more_handlers = impl_->locked_ = !impl_->ready_queue_.empty();
    impl_->mutex_.unlock();

    if (more_handlers)
      io_context_impl_->post_immediate_completion(impl_, false);
  }